

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> __thiscall
wallet::SQLiteBatch::GetNewPrefixCursor(SQLiteBatch *this,Span<const_std::byte> prefix)

{
  byte bVar1;
  Span<const_std::byte> blob;
  Span<const_std::byte> blob_00;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  reference pbVar6;
  pointer pSVar7;
  runtime_error *this_00;
  char *pcVar8;
  long in_RSI;
  __uniq_ptr_data<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>,_true,_true>
  in_RDI;
  long in_FS_OFFSET;
  int res;
  char *stmt_text;
  __single_object cursor;
  reverse_iterator it;
  vector<std::byte,_std::allocator<std::byte>_> end_range;
  vector<std::byte,_std::allocator<std::byte>_> start_range;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_fffffffffffffdb0;
  undefined6 in_stack_fffffffffffffdb8;
  byte in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_fffffffffffffdc0;
  char **in_stack_fffffffffffffdd0;
  undefined6 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffdde;
  undefined1 in_stack_fffffffffffffddf;
  allocator_type *in_stack_fffffffffffffde0;
  byte *in_stack_fffffffffffffde8;
  allocator<char> *__a;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_fffffffffffffdf0;
  sqlite3_stmt *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  string *description;
  int index;
  undefined4 in_stack_fffffffffffffe18;
  reference in_stack_fffffffffffffe50;
  undefined1 *puVar9;
  allocator<char> local_109 [24];
  allocator<char> local_f1 [17];
  undefined8 local_e0;
  allocator<char> local_d8 [16];
  undefined1 local_c8 [160];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*(long *)(in_RSI + 8) + 200) == 0) {
    std::unique_ptr<wallet::DatabaseCursor,std::default_delete<wallet::DatabaseCursor>>::
    unique_ptr<std::default_delete<wallet::DatabaseCursor>,void>
              ((unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> *)
               in_stack_fffffffffffffda8,(nullptr_t)0x17ada0e);
  }
  else {
    Span<const_std::byte>::begin((Span<const_std::byte> *)in_stack_fffffffffffffda8);
    Span<const_std::byte>::end((Span<const_std::byte> *)in_stack_fffffffffffffda8);
    std::allocator<std::byte>::allocator((allocator<std::byte> *)in_stack_fffffffffffffda8);
    std::vector<std::byte,std::allocator<std::byte>>::vector<std::byte_const*,void>
              (in_stack_fffffffffffffdf0,(byte *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffde8
               ,in_stack_fffffffffffffde0);
    std::allocator<std::byte>::~allocator((allocator<std::byte> *)in_stack_fffffffffffffda8);
    Span<const_std::byte>::begin((Span<const_std::byte> *)in_stack_fffffffffffffda8);
    Span<const_std::byte>::end((Span<const_std::byte> *)in_stack_fffffffffffffda8);
    std::allocator<std::byte>::allocator((allocator<std::byte> *)in_stack_fffffffffffffda8);
    std::vector<std::byte,std::allocator<std::byte>>::vector<std::byte_const*,void>
              (in_stack_fffffffffffffdf0,(byte *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffde8
               ,in_stack_fffffffffffffde0);
    std::allocator<std::byte>::~allocator((allocator<std::byte> *)in_stack_fffffffffffffda8);
    std::vector<std::byte,_std::allocator<std::byte>_>::rbegin(in_stack_fffffffffffffdc0);
    while( true ) {
      puVar9 = local_c8;
      std::vector<std::byte,_std::allocator<std::byte>_>::rend(in_stack_fffffffffffffdc0);
      bVar2 = std::
              operator==<__gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                        ((reverse_iterator<__gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffdbf,
                                     CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
                         (reverse_iterator<__gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                          *)in_stack_fffffffffffffdb0);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      in_stack_fffffffffffffe50 =
           std::
           reverse_iterator<__gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>_>
           ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                        *)in_stack_fffffffffffffdb0);
      bVar1 = *in_stack_fffffffffffffe50;
      bVar3 = std::numeric_limits<unsigned_char>::max();
      if (bVar1 != bVar3) {
        pbVar6 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                              *)in_stack_fffffffffffffdb0);
        bVar1 = *pbVar6;
        pbVar6 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                              *)in_stack_fffffffffffffdb0);
        *pbVar6 = bVar1 + 1;
        break;
      }
      pbVar6 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                            *)in_stack_fffffffffffffdb0);
      *pbVar6 = 0;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                    *)in_stack_fffffffffffffda8);
    }
    std::vector<std::byte,_std::allocator<std::byte>_>::rend(in_stack_fffffffffffffdc0);
    bVar2 = std::
            operator==<__gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                      ((reverse_iterator<__gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffdbf,
                                   CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
                       (reverse_iterator<__gnu_cxx::__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                        *)in_stack_fffffffffffffdb0);
    if (bVar2) {
      std::vector<std::byte,_std::allocator<std::byte>_>::clear
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffda8);
    }
    std::
    make_unique<wallet::SQLiteCursor,std::vector<std::byte,std::allocator<std::byte>>&,std::vector<std::byte,std::allocator<std::byte>>&>
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffde0,
               (vector<std::byte,_std::allocator<std::byte>_> *)
               CONCAT17(in_stack_fffffffffffffddf,
                        CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)));
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_>
                        *)in_stack_fffffffffffffda8);
    if (bVar2) {
      bVar2 = std::vector<std::byte,_std::allocator<std::byte>_>::empty
                        ((vector<std::byte,_std::allocator<std::byte>_> *)
                         CONCAT17(in_stack_fffffffffffffdbf,
                                  CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)));
      pcVar8 = "SELECT key, value FROM main WHERE key >= ? AND key < ?";
      if (bVar2) {
        pcVar8 = "SELECT key, value FROM main WHERE key >= ?";
      }
      description = *(string **)(*(long *)(in_RSI + 8) + 200);
      pSVar7 = std::unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_>::
               operator->((unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_>
                           *)in_stack_fffffffffffffda8);
      iVar5 = sqlite3_prepare_v2(description,pcVar8,0xffffffff,&pSVar7->m_cursor_stmt,0);
      index = (int)((ulong)pcVar8 >> 0x20);
      if (iVar5 != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_e0 = sqlite3_errstr(iVar5);
        tinyformat::format<char_const*>
                  ((char *)CONCAT17(in_stack_fffffffffffffddf,
                                    CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)),
                   in_stack_fffffffffffffdd0);
        std::runtime_error::runtime_error(this_00,local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_017ae25c;
      }
      __a = local_d8;
      pSVar7 = std::unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_>::
               operator->((unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_>
                           *)in_stack_fffffffffffffda8);
      __s = pSVar7->m_cursor_stmt;
      std::unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_>::operator->
                ((unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_> *)
                 in_stack_fffffffffffffda8);
      Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<const_std::byte> *)
                 CONCAT17(in_stack_fffffffffffffdbf,
                          CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
                 in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffdf8,(char *)__s,__a);
      blob.m_size = (size_t)puVar9;
      blob.m_data = in_stack_fffffffffffffe50;
      bVar2 = BindBlobToStatement((sqlite3_stmt *)CONCAT44(iVar5,in_stack_fffffffffffffe18),index,
                                  blob,description);
      bVar4 = bVar2 ^ 0xff;
      std::__cxx11::string::~string(in_stack_fffffffffffffda8);
      std::allocator<char>::~allocator(local_f1);
      if ((bVar4 & 1) == 0) {
        bVar2 = std::vector<std::byte,_std::allocator<std::byte>_>::empty
                          ((vector<std::byte,_std::allocator<std::byte>_> *)
                           CONCAT17(in_stack_fffffffffffffdbf,
                                    CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)));
        if (!bVar2) {
          std::unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_>::
          operator->((unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_> *
                     )in_stack_fffffffffffffda8);
          std::unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_>::
          operator->((unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_> *
                     )in_stack_fffffffffffffda8);
          Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                    ((Span<const_std::byte> *)
                     CONCAT17(in_stack_fffffffffffffdbf,
                              CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
                     in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffdf8,(char *)__s,__a);
          blob_00.m_size = (size_t)puVar9;
          blob_00.m_data = in_stack_fffffffffffffe50;
          in_stack_fffffffffffffdbf =
               BindBlobToStatement((sqlite3_stmt *)CONCAT44(iVar5,in_stack_fffffffffffffe18),index,
                                   blob_00,description);
          in_stack_fffffffffffffdbe = in_stack_fffffffffffffdbf ^ 0xff;
          std::__cxx11::string::~string(in_stack_fffffffffffffda8);
          std::allocator<char>::~allocator(local_109);
          if ((in_stack_fffffffffffffdbe & 1) != 0) {
            std::unique_ptr<wallet::DatabaseCursor,std::default_delete<wallet::DatabaseCursor>>::
            unique_ptr<std::default_delete<wallet::DatabaseCursor>,void>
                      ((unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>
                        *)in_stack_fffffffffffffda8,(nullptr_t)0x17ae13a);
            goto LAB_017ae1b7;
          }
        }
        std::unique_ptr<wallet::DatabaseCursor,std::default_delete<wallet::DatabaseCursor>>::
        unique_ptr<wallet::SQLiteCursor,std::default_delete<wallet::SQLiteCursor>,void>
                  ((unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>
                    *)CONCAT17(in_stack_fffffffffffffdbf,
                               CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)),
                   (unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_> *)
                   in_stack_fffffffffffffdb0);
      }
      else {
        std::unique_ptr<wallet::DatabaseCursor,std::default_delete<wallet::DatabaseCursor>>::
        unique_ptr<std::default_delete<wallet::DatabaseCursor>,void>
                  ((unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>
                    *)in_stack_fffffffffffffda8,(nullptr_t)0x17adfec);
      }
    }
    else {
      std::unique_ptr<wallet::DatabaseCursor,std::default_delete<wallet::DatabaseCursor>>::
      unique_ptr<std::default_delete<wallet::DatabaseCursor>,void>
                ((unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> *
                 )in_stack_fffffffffffffda8,(nullptr_t)0x17add47);
    }
LAB_017ae1b7:
    std::unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_>::~unique_ptr
              ((unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_> *)
               CONCAT17(in_stack_fffffffffffffdbf,
                        CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)));
    std::vector<std::byte,_std::allocator<std::byte>_>::~vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)
               CONCAT17(in_stack_fffffffffffffdbf,
                        CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)));
    std::vector<std::byte,_std::allocator<std::byte>_>::~vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)
               CONCAT17(in_stack_fffffffffffffdbf,
                        CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (__uniq_ptr_data<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>,_true,_true>
            )(tuple<wallet::DatabaseCursor_*,_std::default_delete<wallet::DatabaseCursor>_>)
             in_RDI.
             super___uniq_ptr_impl<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::DatabaseCursor_*,_std::default_delete<wallet::DatabaseCursor>_>
             .super__Head_base<0UL,_wallet::DatabaseCursor_*,_false>._M_head_impl;
  }
LAB_017ae25c:
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DatabaseCursor> SQLiteBatch::GetNewPrefixCursor(Span<const std::byte> prefix)
{
    if (!m_database.m_db) return nullptr;

    // To get just the records we want, the SQL statement does a comparison of the binary data
    // where the data must be greater than or equal to the prefix, and less than
    // the prefix incremented by one (when interpreted as an integer)
    std::vector<std::byte> start_range(prefix.begin(), prefix.end());
    std::vector<std::byte> end_range(prefix.begin(), prefix.end());
    auto it = end_range.rbegin();
    for (; it != end_range.rend(); ++it) {
        if (*it == std::byte(std::numeric_limits<unsigned char>::max())) {
            *it = std::byte(0);
            continue;
        }
        *it = std::byte(std::to_integer<unsigned char>(*it) + 1);
        break;
    }
    if (it == end_range.rend()) {
        // If the prefix is all 0xff bytes, clear end_range as we won't need it
        end_range.clear();
    }

    auto cursor = std::make_unique<SQLiteCursor>(start_range, end_range);
    if (!cursor) return nullptr;

    const char* stmt_text = end_range.empty() ? "SELECT key, value FROM main WHERE key >= ?" :
                            "SELECT key, value FROM main WHERE key >= ? AND key < ?";
    int res = sqlite3_prepare_v2(m_database.m_db, stmt_text, -1, &cursor->m_cursor_stmt, nullptr);
    if (res != SQLITE_OK) {
        throw std::runtime_error(strprintf(
            "SQLiteDatabase: Failed to setup cursor SQL statement: %s\n", sqlite3_errstr(res)));
    }

    if (!BindBlobToStatement(cursor->m_cursor_stmt, 1, cursor->m_prefix_range_start, "prefix_start")) return nullptr;
    if (!end_range.empty()) {
        if (!BindBlobToStatement(cursor->m_cursor_stmt, 2, cursor->m_prefix_range_end, "prefix_end")) return nullptr;
    }

    return cursor;
}